

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_class.cpp
# Opt level: O2

void __thiscall
pfederc::Parser::parseClassBody
          (Parser *this,Token *tokId,bool *err,
          list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
          *attributes,
          list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
          *functions)

{
  Token *pTVar1;
  bool bVar2;
  Lexer *pLVar3;
  initializer_list<pfederc::Position> __l;
  undefined1 local_c0 [8];
  undefined1 local_b8 [8];
  undefined1 local_b0 [40];
  _func_int **local_88;
  _Base_ptr local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  Position local_68;
  undefined1 local_48 [16];
  
  local_78 = (_Base_ptr)&PTR__FuncExpr_00128790;
  local_88 = (_func_int **)&PTR__BiOpExpr_00128998;
  local_b0._24_8_ = err;
  local_b0._32_8_ = tokId;
  local_80 = (_Base_ptr)attributes;
  local_70 = (_Base_ptr)functions;
  while( true ) {
    bVar2 = Token::operator!=(this->lexer->currentToken,TOK_STMT);
    if (!bVar2) break;
    bVar2 = Token::operator!=(this->lexer->currentToken,TOK_EOF);
    if (!bVar2) break;
    bVar2 = Token::operator==(this->lexer->currentToken,TOK_EOL);
    if (bVar2) {
      Lexer::next(this->lexer);
    }
    else {
      parseExpression((Parser *)local_b0,(Precedence)this);
      pLVar3 = (Lexer *)local_b0._0_8_;
      if ((Lexer *)local_b0._0_8_ != (Lexer *)0x0) {
        if (*(ExprType *)&(((string *)(local_b0._0_8_ + 0x18))->_M_dataplus)._M_p == EXPR_FUNC) {
          local_b0._0_8_ = (Lexer *)0x0;
          if ((_Base_ptr)*&pLVar3->_vptr_Lexer != local_78) {
            pLVar3 = (Lexer *)0x0;
          }
          local_68.line = (size_t)pLVar3;
          std::__cxx11::
          list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
          ::push_back((list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                       *)local_70,(value_type *)&local_68);
          std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>::~unique_ptr
                    ((unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> *)
                     &local_68);
        }
        else {
          bVar2 = isBiOpExpr((Expr *)local_b0._0_8_,TOK_OP_DCL);
          pLVar3 = (Lexer *)local_b0._0_8_;
          if (bVar2) {
            local_b0._0_8_ = (Lexer *)0x0;
            if ((pLVar3 == (Lexer *)0x0) || (*&pLVar3->_vptr_Lexer != local_88)) {
              pLVar3 = (Lexer *)0x0;
            }
            local_68.line = (size_t)pLVar3;
            std::__cxx11::
            list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
            ::push_back((list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                         *)local_80,(value_type *)&local_68);
            std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>::~unique_ptr
                      ((unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_> *)
                       &local_68);
          }
          else if ((Lexer *)local_b0._0_8_ != (Lexer *)0x0) {
            local_c0._0_2_ = 2;
            local_b8._0_4_ = 0x15;
            std::
            make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                      ((Level *)&local_68,(SyntaxErrorCode *)local_c0,(Position *)local_b8);
            generateError((Parser *)&stack0xffffffffffffffc8,
                          (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                           *)this);
            std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::
            ~unique_ptr((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                        &stack0xffffffffffffffc8);
            std::
            unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
            ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                           *)&local_68);
          }
        }
      }
      bVar2 = expect(this,TOK_EOL);
      if (!bVar2) {
        local_c0._0_2_ = 2;
        local_b8._0_4_ = 0xf;
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                  ((Level *)&local_68,(SyntaxErrorCode *)local_c0,(Position *)local_b8);
        generateError((Parser *)(local_48 + 8),
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)this);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   (local_48 + 8));
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)&local_68);
        skipToStmtEol(this);
      }
      if ((Lexer *)local_b0._0_8_ != (Lexer *)0x0) {
        (*(*(_func_int ***)local_b0._0_8_)[1])();
      }
    }
  }
  bVar2 = expect(this,TOK_STMT);
  if (!bVar2) {
    local_c0._4_2_ = 2;
    local_c0._0_4_ = STX_ERR_EXPECTED_STMT;
    pTVar1 = this->lexer->currentToken;
    local_68.line = ((Position *)(local_b0._32_8_ + 0x18))->line;
    local_68.startIndex = ((Position *)(local_b0._32_8_ + 0x18))->startIndex;
    local_68.endIndex = ((Position *)(local_b0._32_8_ + 0x18))->endIndex;
    __l._M_len = 1;
    __l._M_array = &local_68;
    std::vector<pfederc::Position,_std::allocator<pfederc::Position>_>::vector
              ((vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)local_b0,__l,
               (allocator_type *)(local_c0 + 7));
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&,std::vector<pfederc::Position,std::allocator<pfederc::Position>>>
              ((Level *)local_b8,(SyntaxErrorCode *)(local_c0 + 4),(Position *)local_c0,
               (vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)&pTVar1->pos);
    generateError((Parser *)local_48,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)local_48)
    ;
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)local_b8);
    std::_Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>::~_Vector_base
              ((_Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_> *)local_b0);
    *(bool *)&(((__uniq_ptr_data<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>,_true,_true>
                 *)local_b0._24_8_)->
              super___uniq_ptr_impl<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
              )._M_t.
              super__Tuple_impl<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
              .super__Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false>._M_head_impl
         = true;
  }
  return;
}

Assistant:

void Parser::parseClassBody(const Token *const tokId, bool &err,
    std::list<std::unique_ptr<BiOpExpr>> &attributes,
    std::list<std::unique_ptr<FuncExpr>> &functions) noexcept {

  // classbody
  while (*lexer.getCurrentToken() != TokenType::TOK_STMT
      && *lexer.getCurrentToken() != TokenType::TOK_EOF) {
    if (*lexer.getCurrentToken() == TokenType::TOK_EOL) {
      lexer.next();
      continue;
    }

    std::unique_ptr<Expr> expr(parseExpression());
    if (expr && expr->getType() == ExprType::EXPR_FUNC) {
      functions.push_back(
        std::unique_ptr<FuncExpr>(
          dynamic_cast<FuncExpr*>(expr.release())));
    } else if (expr && isBiOpExpr(*expr, TokenType::TOK_OP_DCL)) {
      attributes.push_back(
        std::unique_ptr<BiOpExpr>(
          dynamic_cast<BiOpExpr*>(expr.release())));
    } else if (expr) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_CLASS_SCOPE, expr->getPosition()));
      // soft error
    }

    if (!expect(TokenType::TOK_EOL)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
      // soft error
      skipToStmtEol();
    }
  }
  // end of class body
  if (!expect(TokenType::TOK_STMT)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_STMT, lexer.getCurrentToken()->getPosition(),
      std::vector<Position> { tokId->getPosition() }));
    err = true;
  }
}